

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::disposeImpl
          (DestructorOnlyDisposer<capnp::compiler::Compiler::Alias> *this,void *pointer)

{
  void *pointer_local;
  DestructorOnlyDisposer<capnp::compiler::Compiler::Alias> *this_local;
  
  capnp::compiler::Compiler::Alias::~Alias((Alias *)pointer);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    reinterpret_cast<T*>(pointer)->~T();
  }